

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerCallIDynamicSpread(Lowerer *this,Instr *callInstr,ushort callFlags)

{
  Func *this_00;
  Instr *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  Instr *insertBeforeInstrForCFG;
  IndirOpnd *pIVar9;
  LabelInstr *target;
  IntConstOpnd *pIVar10;
  RegOpnd *indexOpnd;
  Instr *pIVar11;
  undefined1 *puVar12;
  Lowerer *this_02;
  Lowerer *pLVar13;
  LowererMDArch *this_03;
  
  if (callInstr->m_opcode != CallIDynamicSpread) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54db,"(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamicSpread");
    if (!bVar2) goto LAB_0054d452;
    *puVar3 = 0;
  }
  this_00 = callInstr->m_func;
  bVar2 = Func::IsInlinee(this_00);
  if (bVar2) {
    puVar12 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar12 = 0x25;
    __cxa_throw(puVar12,&Js::RejitException::typeinfo,0);
  }
  pOVar4 = IR::Instr::UnlinkSrc2(callInstr);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  bVar2 = StackSym::IsArgSlotSym(pSVar6);
  if ((!bVar2) || ((pSVar6->field_0x18 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54e9,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar2) goto LAB_0054d452;
    *puVar3 = 0;
  }
  IR::Opnd::Free(&pSVar5->super_Opnd,this->m_func);
  pLVar13 = (Lowerer *)(pSVar6->field_5).m_instrDef;
  if (*(OpCode *)&(pLVar13->m_lowererMD).lowererMDArch.helperCallArgsCount != ArgOut_A_SpreadArg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54ed,"(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg)",
                       "spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg");
    if (!bVar2) goto LAB_0054d452;
    *puVar3 = 0;
  }
  this_02 = pLVar13;
  pOVar4 = IR::Instr::UnlinkSrc1((Instr *)pLVar13);
  pRVar7 = GetRegOpnd(this_02,pOVar4,(Instr *)pLVar13,this_00,TyUint64);
  pOVar4 = IR::Instr::UnlinkSrc2((Instr *)pLVar13);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  bVar2 = StackSym::IsArgSlotSym(pSVar6);
  if ((!bVar2) || ((pSVar6->field_0x18 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x54f6,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar2) goto LAB_0054d452;
    *puVar3 = 0;
  }
  IR::Opnd::Free(&pSVar5->super_Opnd,this->m_func);
  pIVar11 = (pSVar6->field_5).m_instrDef;
  pOVar4 = IR::Instr::UnlinkSrc2(pIVar11);
  pRVar8 = IR::Opnd::AsRegOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(&pRVar8->m_sym->super_Sym);
  IR::Instr::Unlink(pIVar11);
  IR::Instr::FreeDst(pIVar11);
  IR::Instr::Unlink((Instr *)pLVar13);
  IR::Instr::FreeDst((Instr *)pLVar13);
  this_01 = (pSVar6->field_5).m_instrDef;
  if (this_01->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5504,"(startCallInstr->m_opcode == Js::OpCode::StartCall)",
                       "startCallInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar2) {
LAB_0054d452:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  insertBeforeInstrForCFG = IR::Instr::GetNextRealInstr(this_01);
  IR::Instr::Remove(this_01);
  pRVar8 = IR::RegOpnd::New(TyUint32,this_00);
  pIVar9 = IR::IndirOpnd::New(pRVar7,0x20,TyUint32,this_00,false);
  InsertMove(&pRVar8->super_Opnd,&pIVar9->super_Opnd,callInstr,true);
  target = IR::LabelInstr::New(Label,this_00,false);
  pLVar13 = (Lowerer *)0x0;
  pIVar10 = IR::IntConstOpnd::New(0,TyInt8,this_00,false);
  InsertCompareBranch(pLVar13,&pRVar8->super_Opnd,&pIVar10->super_Opnd,BrEq_A,true,target,callInstr,
                      false);
  indexOpnd = IR::RegOpnd::New(TyUint32,this_00);
  InsertMove(&indexOpnd->super_Opnd,&pRVar8->super_Opnd,callInstr,true);
  pIVar9 = IR::IndirOpnd::New(pRVar7,0x28,TyUint64,this_00,false);
  pRVar7 = IR::RegOpnd::New(TyUint64,this_00);
  pIVar10 = IR::IntConstOpnd::New(0x18,TyUint8,this_00,false);
  InsertAdd(false,&pRVar7->super_Opnd,&pIVar9->super_Opnd,&pIVar10->super_Opnd,callInstr);
  this_03 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::LowerInlineSpreadArgOutLoop(this_03,callInstr,indexOpnd,pRVar7);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  callInstr->m_opcode = CallIDynamic;
  pIVar11 = LowererMDArch::LowerCallIDynamic
                      (this_03,callInstr,pIVar11,&pRVar8->super_Opnd,callFlags,
                       insertBeforeInstrForCFG);
  return pIVar11;
}

Assistant:

IR::Instr *
Lowerer::LowerCallIDynamicSpread(IR::Instr *callInstr, ushort callFlags)
{
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamicSpread);

    IR::Instr * insertBeforeInstrForCFG = nullptr;

    Func *const func = callInstr->m_func;

    if (func->IsInlinee())
    {
        throw Js::RejitException(RejitReason::InlineSpreadDisabled);
    }

    IR::Instr *spreadArrayInstr = callInstr;
    IR::SymOpnd    *argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();
    StackSym       *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    spreadArrayInstr = argLinkSym->m_instrDef;

    Assert(spreadArrayInstr->m_opcode == Js::OpCode::ArgOut_A_SpreadArg);

    IR::Opnd *arraySrcOpnd = spreadArrayInstr->UnlinkSrc1();
    IR::RegOpnd *arrayOpnd = GetRegOpnd(arraySrcOpnd, spreadArrayInstr, func, TyMachPtr);

    argLinkOpnd = spreadArrayInstr->UnlinkSrc2()->AsSymOpnd();

    // Walk the arg chain and find the start call
    argLinkSym = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);

    // Nothing to be done for the function object, emit as normal
    IR::Instr *thisInstr = argLinkSym->m_instrDef;
    IR::RegOpnd *thisOpnd = thisInstr->UnlinkSrc2()->AsRegOpnd();
    argLinkSym = thisOpnd->m_sym->AsStackSym();
    thisInstr->Unlink();
    thisInstr->FreeDst();

    // Remove the array ArgOut instr and StartCall, they are no longer needed
    spreadArrayInstr->Unlink();
    spreadArrayInstr->FreeDst();
    IR::Instr *startCallInstr = argLinkSym->m_instrDef;
    Assert(startCallInstr->m_opcode == Js::OpCode::StartCall);
    insertBeforeInstrForCFG = startCallInstr->GetNextRealInstr();
    startCallInstr->Remove();

    IR::RegOpnd *argsLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    IR::IndirOpnd *arrayLengthPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), TyUint32, func);
    Lowerer::InsertMove(argsLengthOpnd, arrayLengthPtrOpnd, callInstr);

    // Don't bother expanding args if there are zero
    IR::LabelInstr *zeroArgsLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertCompareBranch(argsLengthOpnd, IR::IntConstOpnd::New(0, TyInt8, func), Js::OpCode::BrEq_A, true, zeroArgsLabel, callInstr);

    IR::RegOpnd *indexOpnd = IR::RegOpnd::New(TyUint32, func);
    Lowerer::InsertMove(indexOpnd, argsLengthOpnd, callInstr);

    // Get the array head offset and length
    IR::IndirOpnd *arrayHeadPtrOpnd = IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfHead(), TyMachPtr, func);
    IR::RegOpnd *arrayElementsStartOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertAdd(false, arrayElementsStartOpnd, arrayHeadPtrOpnd, IR::IntConstOpnd::New(offsetof(Js::SparseArraySegment<Js::Var>, elements), TyUint8, func), callInstr);

    this->m_lowererMD.LowerInlineSpreadArgOutLoop(callInstr, indexOpnd, arrayElementsStartOpnd);

    // Resume if we have zero args
    callInstr->InsertBefore(zeroArgsLabel);

    // Lower call
    callInstr->m_opcode = Js::OpCode::CallIDynamic;
    callInstr = m_lowererMD.LowerCallIDynamic(callInstr, thisInstr, argsLengthOpnd, callFlags, insertBeforeInstrForCFG);

    return callInstr;
}